

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O0

void __thiscall setup::windows_version::load(windows_version *this,istream *is,version *version)

{
  byte bVar1;
  uint uVar2;
  istream *in_RDX;
  data *in_RSI;
  version *in_RDI;
  
  data::load(in_RSI,in_RDX,in_RDI);
  data::load(in_RSI,in_RDX,in_RDI);
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number
                    ((int_adapter<unsigned_int> *)in_RDX);
  if (uVar2 < 0x1031300) {
    in_RDI[1].value = 0;
    *(undefined4 *)&in_RDI[1].field_0x4 = 0;
  }
  else {
    bVar1 = util::load<unsigned_char>((istream *)0x18cb6f);
    *(uint *)&in_RDI[1].field_0x4 = (uint)bVar1;
    bVar1 = util::load<unsigned_char>((istream *)0x18cb86);
    in_RDI[1].value = (uint)bVar1;
  }
  return;
}

Assistant:

void windows_version::load(std::istream & is, const version & version) {
	
	win_version.load(is, version);
	nt_version.load(is, version);
	
	if(version >= INNO_VERSION(1, 3, 19)) {
		nt_service_pack.minor = util::load<boost::uint8_t>(is);
		nt_service_pack.major = util::load<boost::uint8_t>(is);
	} else {
		nt_service_pack.major = 0, nt_service_pack.minor = 0;
	}
	
}